

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O0

_Bool borg_obj_has_effect(uint32_t kind,wchar_t index,wchar_t subtype)

{
  effect *local_20;
  effect *ke;
  wchar_t subtype_local;
  wchar_t index_local;
  uint32_t kind_local;
  
  local_20 = k_info[kind].effect;
  while( true ) {
    if (local_20 == (effect *)0x0) {
      return false;
    }
    if (((uint)local_20->index == index) &&
       ((local_20->subtype == subtype || (subtype == L'\xffffffff')))) break;
    local_20 = local_20->next;
  }
  return true;
}

Assistant:

bool borg_obj_has_effect(uint32_t kind, int index, int subtype)
{
    struct effect* ke = k_info[kind].effect;
    while (ke) {
        if (ke->index == index && (ke->subtype == subtype || subtype == -1))
            return true;
        ke = ke->next;
    }
    return false;
}